

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

bool __thiscall
trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::grow
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *this,size_type delta)

{
  size_type sVar1;
  ulong __n;
  size_type size;
  size_type delta_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this->buffer);
  __n = sVar1 + delta;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity(this->buffer);
  if (sVar1 < __n) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::max_size(this->buffer);
    if (sVar1 < __n) {
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(this->buffer,__n);
  }
  return true;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = buffer.size() + delta;
        if (size > buffer.capacity())
        {
            if (size > buffer.max_size())
                return false;
            buffer.reserve(size);
        }
        return true;
    }